

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::RewriteFunction
          (ReplaceInvalidOpcodePass *this,Function *function,ExecutionModel model)

{
  anon_class_32_4_6741ca6f local_68;
  function<void_(spvtools::opt::Instruction_*)> local_48;
  Instruction *local_28;
  Instruction *last_line_dbg_inst;
  bool modified;
  Function *pFStack_18;
  ExecutionModel model_local;
  Function *function_local;
  ReplaceInvalidOpcodePass *this_local;
  
  last_line_dbg_inst._3_1_ = 0;
  local_28 = (Instruction *)0x0;
  local_68.modified = (bool *)((long)&last_line_dbg_inst + 3);
  local_68.last_line_dbg_inst = &local_28;
  local_68.model = model;
  local_68.this = this;
  last_line_dbg_inst._4_4_ = model;
  pFStack_18 = function;
  function_local = (Function *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::ReplaceInvalidOpcodePass::RewriteFunction(spvtools::opt::Function*,spv::ExecutionModel)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_48,&local_68);
  opt::Function::ForEachInst(function,&local_48,true,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_48);
  return (bool)(last_line_dbg_inst._3_1_ & 1);
}

Assistant:

bool ReplaceInvalidOpcodePass::RewriteFunction(Function* function,
                                               spv::ExecutionModel model) {
  bool modified = false;
  Instruction* last_line_dbg_inst = nullptr;
  function->ForEachInst(
      [model, &modified, &last_line_dbg_inst, this](Instruction* inst) {
        // Track the debug information so we can have a meaningful message.
        if (inst->opcode() == spv::Op::OpLabel || inst->IsNoLine()) {
          last_line_dbg_inst = nullptr;
          return;
        } else if (inst->IsLine()) {
          last_line_dbg_inst = inst;
          return;
        }

        bool replace = false;
        if (model != spv::ExecutionModel::Fragment &&
            IsFragmentShaderOnlyInstruction(inst)) {
          replace = true;
        }

        if (model != spv::ExecutionModel::TessellationControl &&
            model != spv::ExecutionModel::GLCompute &&
            !context()->IsTargetEnvAtLeast(SPV_ENV_UNIVERSAL_1_3)) {
          if (inst->opcode() == spv::Op::OpControlBarrier) {
            assert(model != spv::ExecutionModel::Kernel &&
                   "Expecting to be working on a shader module.");
            replace = true;
          }
        }

        if (replace) {
          modified = true;
          if (last_line_dbg_inst == nullptr) {
            ReplaceInstruction(inst, nullptr, 0, 0);
          } else {
            // Get the name of the source file.
            uint32_t file_name_id = 0;
            if (last_line_dbg_inst->opcode() == spv::Op::OpLine) {
              file_name_id = last_line_dbg_inst->GetSingleWordInOperand(0);
            } else {  // Shader100::DebugLine
              uint32_t debug_source_id =
                  last_line_dbg_inst->GetSingleWordInOperand(2);
              Instruction* debug_source_inst =
                  context()->get_def_use_mgr()->GetDef(debug_source_id);
              file_name_id = debug_source_inst->GetSingleWordInOperand(2);
            }
            Instruction* file_name =
                context()->get_def_use_mgr()->GetDef(file_name_id);
            const std::string source = file_name->GetInOperand(0).AsString();

            // Get the line number and column number.
            uint32_t line_number =
                last_line_dbg_inst->GetSingleWordInOperand(1);
            uint32_t col_number = last_line_dbg_inst->GetSingleWordInOperand(2);

            // Replace the instruction.
            ReplaceInstruction(inst, source.c_str(), line_number, col_number);
          }
        }
      },
      /* run_on_debug_line_insts = */ true);
  return modified;
}